

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::ZNames::ZNamesLoader::loadNames
          (ZNamesLoader *this,UResourceBundle *zoneStrings,char *key,UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode local_2c;
  UErrorCode *pUStack_28;
  UErrorCode localStatus;
  UErrorCode *errorCode_local;
  char *key_local;
  UResourceBundle *zoneStrings_local;
  ZNamesLoader *this_local;
  
  local_2c = U_ZERO_ERROR;
  pUStack_28 = errorCode;
  errorCode_local = (UErrorCode *)key;
  key_local = (char *)zoneStrings;
  zoneStrings_local = (UResourceBundle *)this;
  clear(this);
  ures_getAllItemsWithFallback_63
            ((UResourceBundle *)key_local,(char *)errorCode_local,&this->super_ResourceSink,
             &local_2c);
  UVar1 = ::U_SUCCESS(local_2c);
  if (UVar1 != '\0') {
    *pUStack_28 = local_2c;
  }
  return;
}

Assistant:

void loadNames(const UResourceBundle* zoneStrings, const char* key, UErrorCode& errorCode) {
        U_ASSERT(zoneStrings != NULL);
        U_ASSERT(key != NULL);
        U_ASSERT(key[0] != '\0');

        UErrorCode localStatus = U_ZERO_ERROR;
        clear();
        ures_getAllItemsWithFallback(zoneStrings, key, *this, localStatus);

        // Ignore errors, but propogate possible warnings.
        if (U_SUCCESS(localStatus)) {
            errorCode = localStatus;
        }
    }